

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWMeshVertexData.h
# Opt level: O0

void __thiscall COLLADAFW::MeshVertexData::~MeshVertexData(MeshVertexData *this)

{
  InputInfos *pIVar1;
  size_t sVar2;
  undefined8 *in_RDI;
  size_t i;
  FloatOrDoubleArray *in_stack_ffffffffffffffd0;
  size_t local_10;
  
  *in_RDI = &PTR__MeshVertexData_00e6d730;
  local_10 = 0;
  while( true ) {
    sVar2 = ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*>::getCount
                      ((ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*> *)(in_RDI + 0xd)
                      );
    if (sVar2 <= local_10) break;
    in_stack_ffffffffffffffd0 =
         (FloatOrDoubleArray *)
         ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*>::operator[]
                   ((ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*> *)(in_RDI + 0xd),
                    local_10);
    pIVar1 = (InputInfos *)(in_stack_ffffffffffffffd0->super_Animatable)._vptr_Animatable;
    if (pIVar1 != (InputInfos *)0x0) {
      InputInfos::~InputInfos((InputInfos *)0xc71b3d);
      operator_delete(pIVar1,0x30);
    }
    local_10 = local_10 + 1;
  }
  ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*>::releaseMemory
            ((ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*> *)
             in_stack_ffffffffffffffd0);
  ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*>::~ArrayPrimitiveType
            ((ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*> *)0xc71b7e);
  FloatOrDoubleArray::~FloatOrDoubleArray(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

virtual ~MeshVertexData()
        {
            for ( size_t i=0; i<mInputInfosArray.getCount(); ++i )
            {
                delete mInputInfosArray [i];
            }
            mInputInfosArray.releaseMemory ();
        }